

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_sorted.c
# Opt level: O0

LY_ERR lyds_additionally_create_rb_tree
                 (lyd_node **first_sibling,lyd_node **leader,lyd_meta *root_meta,rb_node **rbt)

{
  lyd_value_lyds_tree *_lt;
  rb_node *prStack_40;
  LY_ERR ret__;
  rb_node *rbn;
  rb_node **pprStack_30;
  LY_ERR ret;
  rb_node **rbt_local;
  lyd_meta *root_meta_local;
  lyd_node **leader_local;
  lyd_node **first_sibling_local;
  
  pprStack_30 = rbt;
  rbt_local = (rb_node **)root_meta;
  root_meta_local = (lyd_meta *)leader;
  leader_local = first_sibling;
  rbn._4_4_ = lyds_create_node(*leader,&stack0xffffffffffffffc0);
  first_sibling_local._4_4_ = rbn._4_4_;
  if (rbn._4_4_ == LY_SUCCESS) {
    *pprStack_30 = prStack_40;
    first_sibling_local._4_4_ =
         lyds_additionally_create_rb_nodes
                   (leader_local,&root_meta_local->parent,(lyd_meta *)rbt_local,pprStack_30,
                    root_meta_local->parent->next);
    rbt_local[6] = *pprStack_30;
  }
  return first_sibling_local._4_4_;
}

Assistant:

static LY_ERR
lyds_additionally_create_rb_tree(struct lyd_node **first_sibling, struct lyd_node **leader,
        struct lyd_meta *root_meta, struct rb_node **rbt)
{
    LY_ERR ret;
    struct rb_node *rbn;

    /* let's begin with the leader */
    ret = lyds_create_node(*leader, &rbn);
    LY_CHECK_RET(ret);
    *rbt = rbn;

    /* continue with the rest of the nodes */
    ret = lyds_additionally_create_rb_nodes(first_sibling, leader, root_meta, rbt, (*leader)->next);

    /* store pointer to the root */
    RBT_SET(root_meta, *rbt);

    return ret;
}